

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_bitmap_operation.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined2 uVar1;
  undefined2 uVar2;
  uchar *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint8_t uVar7;
  ostream *poVar8;
  imageException *this;
  allocator local_b1;
  Image local_b0;
  undefined1 local_88 [32];
  uint8_t local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  string filePath;
  
  std::__cxx11::string::string((string *)&filePath,"lena.bmp",(allocator *)&local_b0);
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&filePath);
  }
  Bitmap_Operation::Load(&local_b0,&filePath);
  if (local_b0._data != (uchar *)0x0) {
    if (local_b0._colorCount != '\x01') {
      Image_Function::ConvertToGrayScale((Image *)local_88,&local_b0);
      uVar7 = local_68;
      uVar6 = local_88._20_4_;
      uVar4 = local_88._8_8_;
      puVar3 = local_b0._data;
      uVar1 = local_b0._16_2_;
      local_88._8_4_ = local_b0._width;
      local_88._12_4_ = local_b0._height;
      uVar5 = local_88._8_8_;
      local_88._8_4_ = (undefined4)uVar4;
      local_88._12_4_ = SUB84(uVar4,4);
      local_b0._width = local_88._8_4_;
      local_b0._height = local_88._12_4_;
      local_b0._colorCount = local_88[0x10];
      local_b0._alignment = local_88[0x11];
      uVar2 = local_b0._16_2_;
      local_b0._colorCount = (uint8_t)uVar1;
      local_b0._alignment = SUB21(uVar1,1);
      local_88[0x10] = local_b0._colorCount;
      local_88[0x11] = local_b0._alignment;
      local_88._20_4_ = local_b0._rowSize;
      local_b0._rowSize = uVar6;
      local_b0._data = (uchar *)local_88._24_8_;
      local_88._24_8_ = puVar3;
      local_68 = local_b0._type;
      local_b0._type = uVar7;
      local_b0._16_2_ = uVar2;
      local_88._8_8_ = uVar5;
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
                ((ImageTemplate<unsigned_char> *)local_88);
    }
    Image_Function::Histogram(&histogram,&local_b0);
    uVar7 = Image_Function::GetThreshold(&histogram);
    Image_Function::Threshold((Image *)local_88,&local_b0,uVar7);
    uVar7 = local_68;
    uVar6 = local_88._20_4_;
    uVar4 = local_88._8_8_;
    puVar3 = local_b0._data;
    uVar1 = local_b0._16_2_;
    local_88._8_4_ = local_b0._width;
    local_88._12_4_ = local_b0._height;
    uVar5 = local_88._8_8_;
    local_88._8_4_ = (undefined4)uVar4;
    local_88._12_4_ = SUB84(uVar4,4);
    local_b0._width = local_88._8_4_;
    local_b0._height = local_88._12_4_;
    local_b0._colorCount = local_88[0x10];
    local_b0._alignment = local_88[0x11];
    uVar2 = local_b0._16_2_;
    local_b0._colorCount = (uint8_t)uVar1;
    local_b0._alignment = SUB21(uVar1,1);
    local_88[0x10] = local_b0._colorCount;
    local_88[0x11] = local_b0._alignment;
    local_88._20_4_ = local_b0._rowSize;
    local_b0._rowSize = uVar6;
    local_b0._data = (uchar *)local_88._24_8_;
    local_88._24_8_ = puVar3;
    local_68 = local_b0._type;
    local_b0._type = uVar7;
    local_b0._16_2_ = uVar2;
    local_88._8_8_ = uVar5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)local_88);
    std::__cxx11::string::string((string *)local_88,"result.bmp",&local_b1);
    Bitmap_Operation::Save((string *)local_88,&local_b0);
    std::__cxx11::string::~string((string *)local_88);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_b0);
    poVar8 = std::operator<<((ostream *)&std::cout,"Application ended correctly.");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&filePath);
    return 0;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&histogram,"Cannot load ",&local_b1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&histogram,
                 &filePath);
  imageException::imageException(this,(string *)local_88);
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    std::string filePath = "lena.bmp"; // default image path
    if ( argc > 1 ) // Check input data
        filePath = argv[1];

    try // <---- do not forget to put your code into try.. catch block!
    {
        // Load an image from storage
        PenguinV_Image::Image image = Bitmap_Operation::Load( filePath );

        // If the image is empty it means that the image doesn't exist or the file is not readable
        if ( image.empty() )
            throw imageException( std::string("Cannot load ") + filePath );

        // Convert to gray-scale image if it's not
        if ( image.colorCount() != PenguinV_Image::GRAY_SCALE )
            image = Image_Function::ConvertToGrayScale( image );

        // Threshold image with calculated optimal threshold
        const std::vector< uint32_t > histogram = Image_Function::Histogram( image );
        const uint8_t thresholdValue = Image_Function::GetThreshold( histogram );
        image = Image_Function::Threshold( image, thresholdValue );

        // Save result
        Bitmap_Operation::Save( "result.bmp", image );
    }
    catch ( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch ( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}